

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O0

void __thiscall MatchTable::generate(MatchTable *this)

{
  bool bVar1;
  reference ppcVar2;
  RegexTree local_68;
  MatchTool local_60;
  char *local_30;
  char *str;
  iterator __end1;
  iterator __begin1;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  MatchTable *this_local;
  
  __end1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(&this->regs);
  str = (char *)std::vector<const_char_*,_std::allocator<const_char_*>_>::end(&this->regs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                *)&str);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&__end1);
    local_30 = *ppcVar2;
    RegexTree::RegexTree(&local_68,local_30);
    generate_Dtran(&local_60,&local_68);
    std::vector<MatchTool,_std::allocator<MatchTool>_>::push_back(&this->tools,&local_60);
    MatchTool::~MatchTool(&local_60);
    RegexTree::~RegexTree(&local_68);
    __gnu_cxx::
    __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void MatchTable::generate() {
    for (const char* str : regs) {
        tools.push_back(generate_Dtran(RegexTree(str)));
    }
}